

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSize __thiscall QDockAreaLayoutInfo::maximumSize(QDockAreaLayoutInfo *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  int *piVar5;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutItem *item;
  int i;
  bool first;
  QSize tbh;
  QSize max_size;
  int min_perp;
  int b;
  int a;
  QSize result;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff70;
  Orientation o;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int iVar6;
  undefined4 in_stack_ffffffffffffff8c;
  int local_58;
  int local_40 [3];
  int local_34;
  QSize local_30;
  int local_28;
  QSize local_24;
  int local_1c;
  int local_18;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isEmpty((QDockAreaLayoutInfo *)0x56ca70);
  if (bVar1) {
    QSize::QSize((QSize *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                 in_stack_ffffffffffffff68);
  }
  else {
    local_14 = 0;
    local_18 = 0xffffff;
    if ((*(byte *)(in_RDI + 0xb) & 1) != 0) {
      local_14 = 0xffffff;
    }
    local_1c = 0;
    bVar1 = true;
    for (local_58 = 0;
        qVar4 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RDI + 8)),
        local_58 < qVar4; local_58 = local_58 + 1) {
      QList<QDockAreaLayoutItem>::at
                ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffff70,
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      bVar2 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (!bVar2) {
        local_24 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        local_24 = QDockAreaLayoutItem::maximumSize
                             ((QDockAreaLayoutItem *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        in_stack_ffffffffffffff8c = *(undefined4 *)((long)in_RDI + 0x24);
        local_30 = QDockAreaLayoutItem::minimumSize
                             ((QDockAreaLayoutItem *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        local_28 = perp((Orientation)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                        (QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        piVar5 = qMax<int>(&local_1c,&local_28);
        local_1c = *piVar5;
        o = (Orientation)((ulong)in_stack_ffffffffffffff70 >> 0x20);
        if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
          if (!bVar1) {
            local_14 = *(int *)*in_RDI + local_14;
          }
          iVar3 = pick(o,(QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          local_14 = iVar3 + local_14;
        }
        else {
          local_34 = pick(o,(QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          piVar5 = qMin<int>(&local_14,&local_34);
          local_14 = *piVar5;
        }
        local_40[2] = perp((Orientation)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           (QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        piVar5 = qMin<int>(&local_18,local_40 + 2);
        local_18 = *piVar5;
        local_40[1] = 0xffffff;
        piVar5 = qMin<int>(&local_14,local_40 + 1);
        local_14 = *piVar5;
        local_40[0] = 0xffffff;
        piVar5 = qMin<int>(&local_18,local_40);
        local_18 = *piVar5;
        bVar1 = false;
      }
    }
    piVar5 = qMax<int>(&local_18,&local_1c);
    local_18 = *piVar5;
    local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)in_stack_ffffffffffffff70);
    iVar3 = local_14;
    piVar5 = rpick((Orientation)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    *piVar5 = iVar3;
    iVar6 = local_18;
    piVar5 = rperp((Orientation)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    *piVar5 = iVar6;
    tabBarSizeHint(in_stack_ffffffffffffff70);
    bVar1 = QSize::isNull((QSize *)CONCAT44(iVar3,in_stack_ffffffffffffff80));
    if (!bVar1) {
      if (*(uint *)(in_RDI + 0xd) < 2) {
        iVar3 = QSize::height((QSize *)0x56cd7b);
        piVar5 = QSize::rheight((QSize *)0x56cd8c);
        *piVar5 = iVar3 + *piVar5;
      }
      else if (*(uint *)(in_RDI + 0xd) - 2 < 2) {
        iVar3 = QSize::width((QSize *)0x56cda0);
        piVar5 = QSize::rwidth((QSize *)0x56cdb1);
        *piVar5 = iVar3 + *piVar5;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QDockAreaLayoutInfo::maximumSize() const
{
    if (isEmpty())
        return QSize(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);

    int a = 0, b = QWIDGETSIZE_MAX;
#if QT_CONFIG(tabbar)
    if (tabbed)
        a = QWIDGETSIZE_MAX;
#endif

    int min_perp = 0;

    bool first = true;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        QSize max_size = item.maximumSize();
        min_perp = qMax(min_perp, perp(o, item.minimumSize()));

#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMin(a, pick(o, max_size));
        } else
#endif
        {
            if (!first)
                a += *sep;
            a += pick(o, max_size);
        }
        b = qMin(b, perp(o, max_size));

        a = qMin(a, int(QWIDGETSIZE_MAX));
        b = qMin(b, int(QWIDGETSIZE_MAX));

        first = false;
    }

    b = qMax(b, min_perp);

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    QSize tbh = tabBarSizeHint();
    if (!tbh.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
                result.rheight() += tbh.height();
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
                result.rwidth() += tbh.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}